

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

void sx_signal_raise(sx_signal *sig)

{
  code *pcVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)sig);
  if (iVar2 != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c",
                      0x174,"r == 0");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  sig->data[0x58] = '\x01';
  sig->data[0x59] = '\0';
  sig->data[0x5a] = '\0';
  sig->data[0x5b] = '\0';
  pthread_mutex_unlock((pthread_mutex_t *)sig);
  pthread_cond_signal((pthread_cond_t *)(sig->data + 0x28));
  return;
}

Assistant:

void sx_signal_raise(sx_signal* sig)
{
    sx__signal* _sig = (sx__signal*)sig->data;
    int r = pthread_mutex_lock(&_sig->mutex);
    sx_assert(r == 0);
    _sig->value = 1;
    pthread_mutex_unlock(&_sig->mutex);
    pthread_cond_signal(&_sig->cond);
    sx_unused(r);
}